

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void shift_im(DisasContext_conflict2 *s,uint16_t insn,int opsize)

{
  TCGContext_conflict2 *tcg_ctx_00;
  int iVar1;
  int iVar2;
  TCGv_i32 arg1;
  TCGv_i32 ret;
  TCGv_i32 t0;
  TCGv_i32 reg;
  int bits;
  int left;
  int logical;
  int count;
  TCGContext_conflict2 *tcg_ctx;
  int opsize_local;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  left = (int)(uint)insn >> 9 & 7;
  iVar1 = opsize_bytes(opsize);
  iVar1 = iVar1 * 8;
  arg1 = gen_extend(s,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],opsize,
                    (uint)(((insn & 8) != 0 ^ 0xffU) & 1));
  if (left == 0) {
    left = 8;
  }
  tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_V,0);
  if ((insn & 0x100) == 0) {
    tcg_gen_shri_i32_m68k(tcg_ctx_00,QREG_CC_C,arg1,left + -1);
    if ((insn & 8) == 0) {
      tcg_gen_sari_i32_m68k(tcg_ctx_00,QREG_CC_N,arg1,left);
    }
    else {
      tcg_gen_shri_i32_m68k(tcg_ctx_00,QREG_CC_N,arg1,left);
    }
  }
  else {
    tcg_gen_shri_i32_m68k(tcg_ctx_00,QREG_CC_C,arg1,iVar1 - left);
    tcg_gen_shli_i32_m68k(tcg_ctx_00,QREG_CC_N,arg1,left);
    if (((insn & 8) == 0) && (iVar2 = m68k_feature(s->env,0), iVar2 != 0)) {
      if (left < iVar1) {
        ret = tcg_temp_new_i32(tcg_ctx_00);
        tcg_gen_sari_i32_m68k(tcg_ctx_00,QREG_CC_V,arg1,iVar1 + -1);
        tcg_gen_sari_i32_m68k(tcg_ctx_00,ret,arg1,(iVar1 - left) + -1);
        tcg_gen_setcond_i32_m68k(tcg_ctx_00,TCG_COND_NE,QREG_CC_V,QREG_CC_V,ret);
        tcg_temp_free_i32(tcg_ctx_00,ret);
      }
      else {
        tcg_gen_setcond_i32_m68k(tcg_ctx_00,TCG_COND_NE,QREG_CC_V,arg1,QREG_CC_V);
      }
      tcg_gen_neg_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_V);
    }
  }
  gen_ext(tcg_ctx_00,QREG_CC_N,QREG_CC_N,opsize,1);
  tcg_gen_andi_i32_m68k(tcg_ctx_00,QREG_CC_C,QREG_CC_C,1);
  tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_Z,QREG_CC_N);
  tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_X,QREG_CC_C);
  gen_partset_reg(tcg_ctx_00,opsize,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],QREG_CC_N);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static inline void shift_im(DisasContext *s, uint16_t insn, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int count = (insn >> 9) & 7;
    int logical = insn & 8;
    int left = insn & 0x100;
    int bits = opsize_bytes(opsize) * 8;
    TCGv reg = gen_extend(s, DREG(insn, 0), opsize, !logical);

    if (count == 0) {
        count = 8;
    }

    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
    if (left) {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, reg, bits - count);
        tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, reg, count);

        /*
         * Note that ColdFire always clears V (done above),
         * while M68000 sets if the most significant bit is changed at
         * any time during the shift operation.
         */
        if (!logical && m68k_feature(s->env, M68K_FEATURE_M68000)) {
            /* if shift count >= bits, V is (reg != 0) */
            if (count >= bits) {
                tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, reg, QREG_CC_V);
            } else {
                TCGv t0 = tcg_temp_new(tcg_ctx);
                tcg_gen_sari_i32(tcg_ctx, QREG_CC_V, reg, bits - 1);
                tcg_gen_sari_i32(tcg_ctx, t0, reg, bits - count - 1);
                tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, QREG_CC_V, t0);
                tcg_temp_free(tcg_ctx, t0);
            }
            tcg_gen_neg_i32(tcg_ctx, QREG_CC_V, QREG_CC_V);
        }
    } else {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, reg, count - 1);
        if (logical) {
            tcg_gen_shri_i32(tcg_ctx, QREG_CC_N, reg, count);
        } else {
            tcg_gen_sari_i32(tcg_ctx, QREG_CC_N, reg, count);
        }
    }

    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);
    tcg_gen_andi_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 1);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_X, QREG_CC_C);

    gen_partset_reg(tcg_ctx, opsize, DREG(insn, 0), QREG_CC_N);
    set_cc_op(s, CC_OP_FLAGS);
}